

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_pbe.c
# Opt level: O0

int EVP_PBE_alg_add(int nid,EVP_CIPHER *cipher,EVP_MD *md,undefined1 *keygen)

{
  int iVar1;
  int md_nid;
  int cipher_nid;
  undefined4 local_28;
  undefined4 local_24;
  
  if (cipher == (EVP_CIPHER *)0x0) {
    local_24 = -1;
  }
  else {
    local_24 = EVP_CIPHER_get_nid((EVP_CIPHER *)cipher);
  }
  if (md == (EVP_MD *)0x0) {
    local_28 = -1;
  }
  else {
    local_28 = EVP_MD_get_type((EVP_MD *)md);
  }
  iVar1 = EVP_PBE_alg_add_type(0,nid,local_24,local_28,keygen);
  return iVar1;
}

Assistant:

int EVP_PBE_alg_add(int nid, const EVP_CIPHER *cipher, const EVP_MD *md,
                    EVP_PBE_KEYGEN *keygen)
{
    int cipher_nid, md_nid;

    if (cipher)
        cipher_nid = EVP_CIPHER_get_nid(cipher);
    else
        cipher_nid = -1;
    if (md)
        md_nid = EVP_MD_get_type(md);
    else
        md_nid = -1;

    return EVP_PBE_alg_add_type(EVP_PBE_TYPE_OUTER, nid,
                                cipher_nid, md_nid, keygen);
}